

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O1

void __thiscall
arangodb::velocypack::Buffer<unsigned_char>::grow(Buffer<unsigned_char> *this,ValueLength len)

{
  size_t __n;
  uchar *__ptr;
  uchar *__dest;
  Builder *item;
  Builder *this_00;
  Builder *__size;
  undefined1 auVar1 [16];
  double dVar2;
  undefined1 auVar3 [16];
  
  __n = this->_size;
  item = (Builder *)(len + __n);
  auVar1._8_4_ = (int)((ulong)item >> 0x20);
  auVar1._0_8_ = item;
  auVar1._12_4_ = 0x45300000;
  auVar3._8_4_ = (int)(__n >> 0x20);
  auVar3._0_8_ = __n;
  auVar3._12_4_ = 0x45300000;
  dVar2 = (((double)CONCAT44(0x43300000,(int)__n) - 4503599627370496.0) +
          (auVar3._8_8_ - 1.9342813113834067e+25)) * 1.5;
  __size = (Builder *)((long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f | (long)dVar2);
  if (dVar2 <= ((double)CONCAT44(0x43300000,(int)item) - 4503599627370496.0) +
               (auVar1._8_8_ - 1.9342813113834067e+25)) {
    __size = item;
  }
  __ptr = this->_buffer;
  if (__ptr != this->_local) {
    item = __size;
    __dest = (uchar *)realloc(__ptr,(size_t)__size);
    if (__dest != (uchar *)0x0) goto LAB_00103938;
    grow();
  }
  this_00 = __size;
  __dest = (uchar *)malloc((size_t)__size);
  if (__dest == (uchar *)0x0) {
    grow();
    if ((this_00->_stack).
        super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this_00->_stack).
        super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if (this_00->_keyWritten == false) {
        Builder::reportAdd(this_00);
      }
      Builder::set(this_00,(Value *)item);
      return;
    }
    Builder::set(this_00,(Value *)item);
    return;
  }
  memcpy(__dest,__ptr,__n);
LAB_00103938:
  this->_buffer = __dest;
  this->_capacity = (ValueLength)__size;
  return;
}

Assistant:

void grow(ValueLength len) {
    VELOCYPACK_ASSERT(_size + len >= sizeof(_local));

    // need reallocation
    ValueLength newLen = _size + len;
    constexpr double growthFactor = 1.5;
    if (newLen < growthFactor * _size) {
      // ensure the buffer grows sensibly and not by 1 byte only
      newLen = static_cast<ValueLength>(growthFactor * _size);
    }
    VELOCYPACK_ASSERT(newLen > _size);

    // intentionally do not initialize memory here
    // intentionally also do not care about alignments here, as we
    // expect T to be 1-byte-aignable
    VELOCYPACK_ASSERT(newLen > 0);
    T* p;
    if (_buffer != _local) {
      p = static_cast<T*>(velocypack_realloc(_buffer, checkOverflow(newLen)));
      ensureValidPointer(p);
      // realloc will have copied the old data
    } else {
      p = static_cast<T*>(velocypack_malloc(checkOverflow(newLen)));
      ensureValidPointer(p);
      // copy existing data into buffer
      memcpy(p, _buffer, checkOverflow(_size));
    }
    poison(p + _capacity, newLen - _capacity);

    _buffer = p;
    _capacity = newLen;

    VELOCYPACK_ASSERT(_size <= _capacity);
  }